

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O3

float anon_unknown.dwarf_5c268::mapPointToOutside
                (PolylineSegmentedPathwaySegmentRadii *pathway,Vec3 *point)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float radius;
  float segmentDistance;
  float local_84;
  undefined8 local_80;
  float local_78;
  float local_70;
  undefined4 local_6c;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined4 local_50;
  undefined1 local_48 [16];
  
  iVar1 = (*(pathway->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_48._0_4_ = 0.0;
  }
  else {
    lVar2 = 0;
    fVar3 = 0.0;
    local_68._4_4_ = 0;
    local_68._8_4_ = 0;
    local_68._12_4_ = 0;
    local_70 = 3.4028235e+38;
    do {
      local_68._0_4_ = fVar3;
      local_6c = 0;
      local_84 = 0.0;
      local_80 = 0;
      local_78 = 0.0;
      local_58 = 0;
      local_50 = 0;
      (*(pathway->super_SegmentedPathway).super_Pathway._vptr_Pathway[0x13])
                (pathway,lVar2,point,&local_6c,&local_80,&local_58,&local_84);
      fVar3 = point->x - (float)local_80;
      fVar4 = point->y - local_80._4_4_;
      fVar5 = point->z - local_78;
      fVar3 = SQRT(fVar5 * fVar5 + fVar3 * fVar3 + fVar4 * fVar4) - local_84;
      auVar6._0_4_ = ~-(uint)(fVar3 < local_70) & local_68._0_4_;
      auVar6._4_4_ = local_68._4_4_;
      auVar6._8_4_ = local_68._8_4_;
      auVar6._12_4_ = local_68._12_4_;
      local_48 = auVar6 | ZEXT416(-(uint)(fVar3 < local_70) & (uint)fVar3);
      if (local_70 <= fVar3) {
        fVar3 = local_70;
      }
      local_68 = ZEXT416((uint)fVar3);
      (*(pathway->super_SegmentedPathway).super_Pathway._vptr_Pathway[0xb])(pathway,lVar2);
      lVar2 = lVar2 + 1;
      fVar3 = (float)local_48._0_4_;
      local_68._4_4_ = local_48._4_4_;
      local_68._8_4_ = local_48._8_4_;
      local_68._12_4_ = local_48._12_4_;
      local_70 = (float)local_68._0_4_;
    } while (CONCAT44(extraout_var,iVar1) != lVar2);
  }
  return (float)local_48._0_4_;
}

Assistant:

float mapPointToOutside( OpenSteer::PolylineSegmentedPathwaySegmentRadii const& pathway, OpenSteer::Vec3 const& point ) {
        PointToOutsideMapping mapping;
        OpenSteer::mapPointToPathAlike( pathway, point, mapping);
        return mapping.distancePointToPathBoundary;    
    }